

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

Bool FindCSSSpanEq(Node *node,ctmbstr *s,Bool deprecatedOnly)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if ((int)lVar1 == 0x78) {
      return no;
    }
    if (deprecatedOnly == no) {
      if (node != (Node *)0x0) goto LAB_001494a7;
    }
    else if ((node != (Node *)0x0) && (*(int *)((long)&DAT_001dae10 + lVar1) != 0)) {
LAB_001494a7:
      if ((node->tag != (Dict *)0x0) && (node->tag->id == *(TidyTagId *)(&DAT_001dae00 + lVar1))) {
        *s = *(ctmbstr *)(&UNK_001dae08 + lVar1);
        return yes;
      }
    }
    lVar1 = lVar1 + 0x18;
  } while( true );
}

Assistant:

static
Bool FindCSSSpanEq( Node *node, ctmbstr *s, Bool deprecatedOnly )
{
    struct
    {
        TidyTagId id;
        ctmbstr CSSeq;
        Bool deprecated;
    }
    const CSS_SpanEq[] =
        {
            { TidyTag_B, "font-weight: bold", no },
            { TidyTag_I, "font-style: italic", no },
            { TidyTag_S, "text-decoration: line-through", yes},
            { TidyTag_STRIKE, "text-decoration: line-through", yes},
            { TidyTag_U, "text-decoration: underline", yes},
            { TidyTag_UNKNOWN, NULL, no }
        };
    uint i;

    for (i=0; CSS_SpanEq[i].CSSeq; ++i)
        if ( (!deprecatedOnly || CSS_SpanEq[i].deprecated)
             && TagIsId(node, CSS_SpanEq[i].id) )
        {
            *s = CSS_SpanEq[i].CSSeq;
            return yes;
        }
    return no; 
}